

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::update_torrent_info_hash
          (session_impl *this,shared_ptr<libtorrent::aux::torrent> *t,info_hash_t *old_ih)

{
  element_type *this_00;
  info_hash_t *ih;
  shared_ptr<libtorrent::aux::torrent> local_30;
  info_hash_t *local_20;
  info_hash_t *old_ih_local;
  shared_ptr<libtorrent::aux::torrent> *t_local;
  session_impl *this_local;
  
  local_20 = old_ih;
  old_ih_local = (info_hash_t *)t;
  t_local = (shared_ptr<libtorrent::aux::torrent> *)this;
  torrent_list<libtorrent::aux::torrent>::erase(&this->m_torrents,old_ih);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)old_ih_local);
  ih = torrent::info_hash(this_00);
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            (&local_30,(shared_ptr<libtorrent::aux::torrent> *)old_ih_local);
  torrent_list<libtorrent::aux::torrent>::insert(&this->m_torrents,ih,&local_30);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr(&local_30);
  return;
}

Assistant:

void session_impl::update_torrent_info_hash(std::shared_ptr<torrent> const& t
		, info_hash_t const& old_ih)
	{
		m_torrents.erase(old_ih);
		m_torrents.insert(t->info_hash(), t);
	}